

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O2

Own<capnp::ClientHook> __thiscall
capnp::anon_unknown_0::MembranePipelineHook::getPipelinedCap
          (MembranePipelineHook *this,ArrayPtr<const_capnp::PipelineOp> ops)

{
  ClientHook *extraout_RDX;
  PipelineOp *pPVar1;
  Own<capnp::ClientHook> OVar2;
  Own<capnp::ClientHook> OStack_28;
  
  pPVar1 = ops.ptr;
  (**(code **)(*(long *)pPVar1[4] + 8))(&OStack_28,pPVar1[4],ops.size_);
  membrane((anon_unknown_0 *)this,&OStack_28,(MembranePolicy *)pPVar1[6],SUB41(pPVar1[7].type,0));
  kj::Own<capnp::ClientHook>::dispose(&OStack_28);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

kj::Own<ClientHook> getPipelinedCap(kj::ArrayPtr<const PipelineOp> ops) override {
    return membrane(inner->getPipelinedCap(ops), *policy, reverse);
  }